

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

bool cashew::JSPrinter::isBlock(Ref node)

{
  bool bVar1;
  Ref *this;
  Ref local_10;
  Ref node_local;
  
  if (((node.inst)->type == Array) &&
     (((((node.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
      usedElements != 0)) {
    local_10.inst = node.inst;
    this = Ref::operator[](&local_10,0);
    bVar1 = Ref::operator==(this,(IString *)&BLOCK);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool isBlock(Ref node) {
    return node->isArray() && !node->empty() && node[0] == BLOCK;
  }